

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.h
# Opt level: O0

_HashNode * __thiscall SQTable::_GetStr(SQTable *this,SQRawObjectVal key,SQHash hash)

{
  _HashNode *n;
  SQHash hash_local;
  SQRawObjectVal key_local;
  SQTable *this_local;
  
  n = this->_nodes + hash;
  while (((n->key).super_SQObject._unVal.pTable != (SQTable *)key ||
         ((n->key).super_SQObject._type != OT_STRING))) {
    n = n->next;
    if (n == (_HashNode *)0x0) {
      return (_HashNode *)0x0;
    }
  }
  return n;
}

Assistant:

inline _HashNode *_GetStr(const SQRawObjectVal key, SQHash hash) const
    {
        _HashNode *n = &_nodes[hash];
        do{
            if(_rawval(n->key) == key && sq_type(n->key) == OT_STRING){
                return n;
            }
        }while((n = n->next));
        return NULL;
    }